

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O1

bool __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::emplace(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
         basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,size_t size)

{
  Item *pIVar1;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>
  _Var2;
  Item *pIVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  pVar4;
  size_t local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined1 *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = (undefined1 *)&local_28;
  local_28 = size;
  local_20 = k;
  local_10 = v;
  pVar4 = ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::__cxx11::string&&,unsigned_long&>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->items,&::std::piecewise_construct,&local_20);
  _Var2 = pVar4.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
          ._M_cur;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *(long *)((long)_Var2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                    ._M_cur + 0x38) =
         (long)_Var2.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
               ._M_cur + 8;
    *(size_t *)
     ((long)_Var2.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
            ._M_cur + 0x60) = local_28;
    this->total_size = this->total_size + local_28;
    pIVar3 = (Item *)((long)_Var2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                            ._M_cur + 0x28);
    pIVar1 = this->head;
    *(Item **)((long)_Var2.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                     ._M_cur + 0x30) = pIVar1;
    if (pIVar1 != (Item *)0x0) {
      pIVar1->prev = pIVar3;
    }
    this->head = pIVar3;
    if (this->tail == (Item *)0x0) {
      this->tail = pIVar3;
    }
  }
  return (bool)(pVar4.second & 1);
}

Assistant:

bool emplace(KeyT&& k, ValueT&& v, size_t size = 1) {
    auto emplace_ret = this->items.emplace(std::piecewise_construct,
        std::forward_as_tuple(std::move(k)),
        std::forward_as_tuple(std::move(v), size));

    if (emplace_ret.second) {
      // Item was inserted; set the key pointer, link the item and update the
      // total size appropriately.
      auto& i = emplace_ret.first->second;
      i.key = &emplace_ret.first->first;
      i.size = size;
      this->total_size += size;
      this->link_item(&i);
      return true;
    } else {
      return false;
    }
  }